

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void drop_prog_elven_gem(OBJ_DATA *obj,CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  
  pOVar1 = ch->in_room->contents;
  if (pOVar1 != (OBJ_DATA *)0x0) {
    do {
      if (obj->pIndexData->vnum == pOVar1->pIndexData->vnum) {
        act("As $p falls to the floor, it disintegrates and becomes a cloud of dust.",ch,obj,
            (void *)0x0,0);
        extract_obj(obj);
        return;
      }
      pOVar1 = pOVar1->next_content;
    } while (pOVar1 != (OBJ_DATA *)0x0);
  }
  return;
}

Assistant:

void drop_prog_elven_gem(OBJ_DATA *obj, CHAR_DATA *ch)
{
	OBJ_DATA *obj2;

	for (obj2 = ch->in_room->contents; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj->pIndexData->vnum == obj2->pIndexData->vnum)
		{
			act("As $p falls to the floor, it disintegrates and becomes a cloud of dust.", ch, obj, 0, TO_ROOM);
			extract_obj(obj);
			break;
		}
	}
}